

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall
pfederc::ArrayLitExpr::ArrayLitExpr
          (ArrayLitExpr *this,Lexer *lexer,Position *pos,
          list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *exprs)

{
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *plVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  _List_node_base *p_Var4;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_ARRLIT;
  sVar3 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar3;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ArrayLitExpr_00127a30;
  plVar1 = &this->exprs;
  p_Var4 = (exprs->
           super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  (this->exprs).
  super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = p_Var4;
  p_Var2 = (exprs->
           super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  (this->exprs).
  super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var2;
  (this->exprs).
  super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl._M_node._M_size =
       (exprs->
       super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl._M_node._M_size;
  if (p_Var4 == (_List_node_base *)exprs) {
    (this->exprs).
    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->exprs).
    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  }
  else {
    p_Var2->_M_next = (_List_node_base *)plVar1;
    ((plVar1->
     super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
     )._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar1;
    (exprs->
    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)exprs;
    (exprs->
    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)exprs;
    (exprs->
    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    )._M_impl._M_node._M_size = 0;
    p_Var4 = (plVar1->
             super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 != (_List_node_base *)plVar1) {
      do {
        (p_Var4[1]._M_next)->_M_prev = (_List_node_base *)this;
        p_Var4 = p_Var4->_M_next;
      } while (p_Var4 != (_List_node_base *)plVar1);
      return;
    }
  }
  __assert_fail("!this->exprs.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x3b6,
                "pfederc::ArrayLitExpr::ArrayLitExpr(const Lexer &, const Position &, std::list<std::unique_ptr<Expr>> &&)"
               );
}

Assistant:

ArrayLitExpr::ArrayLitExpr(const Lexer &lexer, const Position &pos,
     std::list<std::unique_ptr<Expr>> &&exprs) noexcept
     : Expr(lexer, ExprType::EXPR_ARRLIT, pos),
       exprs(std::move(exprs)) {
  assert(!this->exprs.empty());

  _setParents(this->exprs, this);
}